

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O3

shared_ptr<opentracing::v3::Tracer> __thiscall
jaegertracing::Tracer::make
          (Tracer *this,string *serviceName,Config *config,
          shared_ptr<jaegertracing::logging::Logger> *logger,StatsFactory *statsFactory,int options)

{
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&> *pPVar1
  ;
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  *pPVar2;
  Tracer *this_00;
  invalid_argument *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  undefined4 in_register_0000008c;
  shared_ptr<opentracing::v3::Tracer> sVar4;
  shared_ptr<jaegertracing::samplers::Sampler> sampler;
  shared_ptr<jaegertracing::metrics::Metrics> metrics;
  shared_ptr<jaegertracing::reporters::Reporter> reporter;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>_>
  local_58;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_48._16_8_ = CONCAT44(in_register_0000008c,options);
  if (serviceName->_M_string_length != 0) {
    if (config->_disabled == true) {
      sVar4 = opentracing::v3::MakeNoopTracer();
      _Var3 = sVar4.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      metrics.super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<jaegertracing::metrics::Metrics,std::allocator<jaegertracing::metrics::Metrics>,jaegertracing::metrics::StatsFactory&>
                (&metrics.
                  super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Metrics **)&metrics,
                 (allocator<jaegertracing::metrics::Metrics> *)local_48,statsFactory);
      local_48._0_8_ = (element_type *)0x0;
      local_48._8_8_ = 0;
      local_58.
      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_58.
      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (config->_propagationFormat == W3C) {
        pPVar1 = (Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                  *)operator_new(0xa0);
        propagation::
        Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
        Propagator(pPVar1,&config->_headers,&metrics);
        (pPVar1->super_Extractor<const_opentracing::v3::TextMapReader_&>)._vptr_Extractor =
             (_func_int **)&PTR__Propagator_002707c0;
        (pPVar1->super_Injector<const_opentracing::v3::TextMapWriter_&>)._vptr_Injector =
             (_func_int **)&PTR__W3CPropagator_00270818;
        sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pPVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<jaegertracing::propagation::W3CPropagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>*>
                  (&sampler.
                    super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (W3CPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                    *)pPVar1);
        local_48._0_8_ =
             sampler.
             super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_48._8_8_ =
             sampler.
             super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        pPVar2 = (Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
                  *)operator_new(0xa0);
        propagation::
        Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
        ::Propagator(pPVar2,&config->_headers,&metrics);
        (pPVar2->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor =
             (_func_int **)&PTR__Propagator_00270950;
        (pPVar2->super_Injector<const_opentracing::v3::HTTPHeadersWriter_&>)._vptr_Injector =
             (_func_int **)&PTR__W3CHTTPHeaderPropagator_002709a8;
        sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pPVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<jaegertracing::propagation::W3CHTTPHeaderPropagator*>
                  (&sampler.
                    super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(W3CHTTPHeaderPropagator *)pPVar2);
      }
      else {
        pPVar1 = (Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                  *)operator_new(0xa0);
        propagation::
        Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
        Propagator(pPVar1,&config->_headers,&metrics);
        (pPVar1->super_Extractor<const_opentracing::v3::TextMapReader_&>)._vptr_Extractor =
             (_func_int **)&PTR__Propagator_00270af8;
        (pPVar1->super_Injector<const_opentracing::v3::TextMapWriter_&>)._vptr_Injector =
             (_func_int **)&PTR__JaegerPropagator_00270b50;
        sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pPVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<jaegertracing::propagation::JaegerPropagator<opentracing::v3::TextMapReader_const&,opentracing::v3::TextMapWriter_const&>*>
                  (&sampler.
                    super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
                    *)pPVar1);
        local_48._0_8_ =
             sampler.
             super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_48._8_8_ =
             sampler.
             super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        pPVar2 = (Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
                  *)operator_new(0xa0);
        propagation::
        Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
        ::Propagator(pPVar2,&config->_headers,&metrics);
        (pPVar2->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor =
             (_func_int **)&PTR__Propagator_00270ba0;
        (pPVar2->super_Injector<const_opentracing::v3::HTTPHeadersWriter_&>)._vptr_Injector =
             (_func_int **)&PTR__JaegerHTTPHeaderPropagator_00270bf8;
        sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pPVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<jaegertracing::propagation::JaegerHTTPHeaderPropagator*>
                  (&sampler.
                    super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(JaegerHTTPHeaderPropagator *)pPVar2);
      }
      local_58.
      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                sampler.
                super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      local_58.
      super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      samplers::Config::makeSampler
                ((Config *)&reporter,&(config->_sampler)._type,(Logger *)serviceName,
                 (Metrics *)
                 (logger->
                 super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>,void>
                ((__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2> *)
                 &sampler,(unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                           *)&reporter);
      if (reporter.
          super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        (*(reporter.
           super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_vptr_Reporter[1])();
      }
      reporters::Config::makeReporter
                ((Config *)&local_68,(string *)&config->_reporter,(Logger *)serviceName,
                 (Metrics *)
                 (logger->
                 super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::__shared_ptr<jaegertracing::reporters::Reporter,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<jaegertracing::reporters::Reporter,std::default_delete<jaegertracing::reporters::Reporter>,void>
                ((__shared_ptr<jaegertracing::reporters::Reporter,(__gnu_cxx::_Lock_policy)2> *)
                 &reporter,
                 (unique_ptr<jaegertracing::reporters::Reporter,_std::default_delete<jaegertracing::reporters::Reporter>_>
                  *)&local_68._M_allocated_capacity);
      if ((_func_int **)local_68._M_allocated_capacity != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_68._M_allocated_capacity + 8))();
      }
      this_00 = (Tracer *)operator_new(0xb68);
      Tracer(this_00,serviceName,&sampler,&reporter,logger,&metrics,
             (shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>_>
              *)local_48,&local_58,&config->_tags,(int)local_48._16_8_);
      std::__shared_ptr<jaegertracing::Tracer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<jaegertracing::Tracer,void>
                ((__shared_ptr<jaegertracing::Tracer,(__gnu_cxx::_Lock_policy)2> *)
                 local_68._M_local_buf,this_00);
      (this->super_Tracer)._vptr_Tracer = (_func_int **)local_68._M_allocated_capacity;
      (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
      super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68._8_8_;
      _Var3._M_pi = extraout_RDX;
      if (reporter.
          super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (reporter.
                   super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_00;
      }
      if (sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sampler.
                   super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_01;
      }
      if (local_58.
          super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
        _Var3._M_pi = extraout_RDX_03;
      }
      if (metrics.super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (metrics.
                   super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_04;
      }
    }
    sVar4.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var3._M_pi;
    sVar4.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &this->super_Tracer;
    return (shared_ptr<opentracing::v3::Tracer>)
           sVar4.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"no service name provided");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<opentracing::Tracer>
Tracer::make(const std::string& serviceName,
                   const Config& config,
     const std::shared_ptr<logging::Logger>& logger,
     metrics::StatsFactory& statsFactory, int options)
{
    if (serviceName.empty()) {
        throw std::invalid_argument("no service name provided");
    }

    if (config.disabled()) {
        return opentracing::MakeNoopTracer();
    }

    auto metrics = std::make_shared<metrics::Metrics>(statsFactory);

    std::shared_ptr<TextMapPropagator> textPropagator;
    std::shared_ptr<HTTPHeaderPropagator> httpHeaderPropagator;
    if (config.propagationFormat() == propagation::Format::W3C) {
        textPropagator = std::shared_ptr<TextMapPropagator>(
            new propagation::W3CTextMapPropagator(config.headers(), metrics));
        httpHeaderPropagator = std::shared_ptr<HTTPHeaderPropagator>(
            new propagation::W3CHTTPHeaderPropagator(config.headers(),
                                                     metrics));
    }
    else {
        textPropagator = std::shared_ptr<TextMapPropagator>(
            new propagation::JaegerTextMapPropagator(config.headers(),
                                                     metrics));
        httpHeaderPropagator = std::shared_ptr<HTTPHeaderPropagator>(
            new propagation::JaegerHTTPHeaderPropagator(config.headers(),
                                                        metrics));
    }

    std::shared_ptr<samplers::Sampler> sampler(
        config.sampler().makeSampler(serviceName, *logger, *metrics));
    std::shared_ptr<reporters::Reporter> reporter(
        config.reporter().makeReporter(serviceName, *logger, *metrics));
    return std::shared_ptr<Tracer>(new Tracer(serviceName,
                                              sampler,
                                              reporter,
                                              logger,
                                              metrics,
                                              textPropagator,
                                              httpHeaderPropagator,
                                              config.tags(),
                                              options));
}